

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O3

bool __thiscall wallet::WalletBatch::WriteLockedUTXO(WalletBatch *this,COutPoint *output)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32_t uVar2;
  bool bVar3;
  long in_FS_OFFSET;
  uchar local_99;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<transaction_identifier<false>,_unsigned_int>_>
  local_70;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_98 = *(undefined4 *)(output->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uStack_94 = *(undefined4 *)((output->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 4);
  uStack_90 = *(undefined4 *)((output->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uStack_8c = *(undefined4 *)((output->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0xc);
  local_88 = *(undefined4 *)((output->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  uStack_84 = *(undefined4 *)((output->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x14)
  ;
  uStack_80 = *(undefined4 *)((output->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18)
  ;
  uStack_7c = *(undefined4 *)((output->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x1c)
  ;
  uVar2 = output->n;
  paVar1 = &local_70.first.field_2;
  local_70.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,DBKeys::LOCKED_UTXO_abi_cxx11_,
             DAT_013d7058 + DBKeys::LOCKED_UTXO_abi_cxx11_);
  local_70.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems._4_4_ = uStack_94;
  local_70.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_4_ = local_98;
  local_70.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems._12_4_ = uStack_8c;
  local_70.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_4_ = uStack_90;
  local_70.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems._20_4_ = uStack_84;
  local_70.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_4_ = local_88;
  local_70.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems._28_4_ = uStack_7c;
  local_70.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_4_ = uStack_80;
  local_99 = '1';
  local_70.second.second = uVar2;
  bVar3 = WriteIC<std::pair<std::__cxx11::string,std::pair<transaction_identifier<false>,unsigned_int>>,unsigned_char>
                    (this,&local_70,&local_99,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.first._M_dataplus._M_p,local_70.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteLockedUTXO(const COutPoint& output)
{
    return WriteIC(std::make_pair(DBKeys::LOCKED_UTXO, std::make_pair(output.hash, output.n)), uint8_t{'1'});
}